

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partiallock.cc
# Opt level: O0

int plock_init(plock *plock,plock_config *config)

{
  list_elem *plVar1;
  undefined8 *in_RSI;
  list *in_RDI;
  int local_4;
  
  if ((in_RDI == (list *)0x0) || (in_RSI == (undefined8 *)0x0)) {
    local_4 = -1;
  }
  else {
    plVar1 = (list_elem *)malloc(0x48);
    in_RDI[2].head = plVar1;
    if (in_RDI[2].head == (list_elem *)0x0) {
      local_4 = -2;
    }
    else {
      memcpy(in_RDI[2].head,(void *)*in_RSI,0x48);
      in_RDI[2].tail = (list_elem *)in_RSI[1];
      in_RDI[3].head = (list_elem *)in_RSI[2];
      in_RDI[3].tail = (list_elem *)in_RSI[3];
      in_RDI[4].tail = (list_elem *)in_RSI[4];
      plVar1 = (list_elem *)malloc((size_t)in_RDI[3].head);
      in_RDI[4].head = plVar1;
      (*(code *)in_RDI[2].head[2].prev)(in_RDI[4].head);
      list_init(in_RDI);
      list_init(in_RDI + 1);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int plock_init(struct plock *plock, struct plock_config *config)
{
    if (!plock || !config) {
        return PLOCK_RESULT_INVALID_ARGS;
    }

    plock->ops = (struct plock_ops *)malloc(sizeof(struct plock_ops));
    if (!plock->ops) {
        return PLOCK_RESULT_ALLOC_FAIL;
    }
    *plock->ops = *(config->ops);

    // allocate and init lock
    plock->sizeof_lock_user = config->sizeof_lock_user;
    plock->sizeof_lock_internal = config->sizeof_lock_internal;
    plock->sizeof_range = config->sizeof_range;
    plock->aux = config->aux;
    plock->lock = (void *)malloc(plock->sizeof_lock_internal);
    plock->ops->init_internal(plock->lock);

    // init list and tree
    list_init(&plock->active);
    list_init(&plock->inactive);

    return PLOCK_RESULT_SUCCESS;
}